

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O2

char * google::protobuf::internal::TcParser::FastMtS2
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  TcParseTableBase *table_00;
  bool bVar1;
  uint uVar2;
  uint *puVar3;
  MessageLite **ppMVar4;
  MessageLite *pMVar5;
  ulong uVar6;
  Nullable<const_char_*> failure_msg;
  char *pcVar7;
  ushort *puVar8;
  int v1;
  Arena *arena;
  LogMessageFatal local_48;
  undefined4 local_34;
  
  if (data.field_0._0_2_ != 0) {
    pcVar7 = MiniParse(msg,ptr,ctx,data,table,hasbits);
    return pcVar7;
  }
  if ((ulong)table->has_bits_offset != 0) {
    puVar3 = RefAt<unsigned_int>(msg,(ulong)table->has_bits_offset);
    *puVar3 = *puVar3 | (uint)hasbits | (uint)(1L << (data.field_0._2_1_ & 0x3f));
  }
  ppMVar4 = RefAt<google::protobuf::MessageLite*>(msg,(ulong)data.field_0 >> 0x30);
  table_00 = *(TcParseTableBase **)
              ((long)&table->has_bits_offset +
              ((ulong)data.field_0 >> 0x18 & 0xff) * 8 + (ulong)table->aux_offset);
  if (*ppMVar4 == (MessageLite *)0x0) {
    arena = (Arena *)(msg->_internal_metadata_).ptr_;
    if (((ulong)arena & 1) != 0) {
      arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
    }
    pMVar5 = ClassData::New(table_00->class_data,arena);
    *ppMVar4 = pMVar5;
  }
  local_48.super_LogMessage._0_8_ = ptr + 2;
  ReadSize((char **)&local_48);
  if (((ushort *)local_48.super_LogMessage._0_8_ == (ushort *)0x0) || (ctx->depth_ < 1)) {
    return (char *)0x0;
  }
  EpsCopyInputStream::PushLimit
            ((EpsCopyInputStream *)&stack0xffffffffffffffcc,(char *)ctx,
             local_48.super_LogMessage.errno_saver_.saved_errno_);
  v1 = ctx->depth_ + -1;
  ctx->depth_ = v1;
  if ((ushort *)local_48.super_LogMessage._0_8_ == (ushort *)0x0) {
    return (char *)0x0;
  }
  pMVar5 = *ppMVar4;
  while (bVar1 = ParseContext::Done(ctx,(char **)&local_48), !bVar1) {
    uVar2 = (uint)table_00->fast_idx_mask & (uint)*(ushort *)local_48.super_LogMessage._0_8_;
    if ((uVar2 & 7) != 0) {
      protobuf_assumption_failed
                ("(idx & 7) == 0",
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_impl.h"
                 ,0x452);
    }
    uVar6 = (ulong)(uVar2 & 0xfffffff8);
    local_48.super_LogMessage._0_8_ =
         (**(code **)(&table_00[1].has_bits_offset + uVar6))
                   (pMVar5,local_48.super_LogMessage._0_8_,ctx,
                    (ulong)*(ushort *)local_48.super_LogMessage._0_8_ ^
                    *(ulong *)(&table_00[1].fast_idx_mask + uVar6 * 2),table_00,0);
    if (((ushort *)local_48.super_LogMessage._0_8_ == (ushort *)0x0) ||
       ((ctx->super_EpsCopyInputStream).last_tag_minus_1_ != 0)) break;
  }
  if ((table_00->field_0x9 & 1) == 0) {
    puVar8 = (ushort *)local_48.super_LogMessage._0_8_;
    if ((ushort *)local_48.super_LogMessage._0_8_ == (ushort *)0x0) {
      VerifyHasBitConsistency(pMVar5,table_00);
      puVar8 = (ushort *)local_48.super_LogMessage._0_8_;
      goto LAB_001dcbcc;
    }
  }
  else {
    puVar8 = (ushort *)
             (*table_00->post_loop_handler)(pMVar5,(char *)local_48.super_LogMessage._0_8_,ctx);
LAB_001dcbcc:
    if (puVar8 == (ushort *)0x0) {
      puVar8 = (ushort *)0x0;
      goto LAB_001dcb56;
    }
  }
  failure_msg = absl::lts_20250127::log_internal::Check_EQImpl(v1,ctx->depth_,"old_depth == depth_")
  ;
  if (failure_msg != (Nullable<const_char_*>)0x0) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              (&local_48,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/parse_context.h"
               ,0x481,failure_msg);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_48);
  }
LAB_001dcb56:
  ctx->depth_ = ctx->depth_ + 1;
  local_48.super_LogMessage.errno_saver_.saved_errno_ = local_34;
  bVar1 = EpsCopyInputStream::PopLimit(&ctx->super_EpsCopyInputStream,(LimitToken *)&local_48);
  if (bVar1) {
    return (char *)puVar8;
  }
  return (char *)0x0;
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::FastMtS2(PROTOBUF_TC_PARAM_DECL) {
  PROTOBUF_MUSTTAIL return SingularParseMessageAuxImpl<uint16_t, false, true>(
      PROTOBUF_TC_PARAM_PASS);
}